

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::HostMemoryAccess::execute
          (HostMemoryAccess *this,ExecuteContext *context)

{
  byte bVar1;
  value_type vVar2;
  byte bVar3;
  deUint8 dVar4;
  void *pvVar5;
  byte *pbVar6;
  reference pvVar7;
  ulong uStack_68;
  deUint8 value_2;
  size_t pos_2;
  ulong uStack_58;
  deUint8 value_1;
  size_t pos_1;
  deUint8 value;
  ulong uStack_48;
  deUint8 mask;
  size_t pos;
  deUint8 *ptr;
  Random rng;
  ExecuteContext *context_local;
  HostMemoryAccess *this_local;
  
  rng.m_rnd._8_8_ = context;
  de::Random::Random((Random *)&ptr,this->m_seed);
  pvVar5 = ExecuteContext::getMapping((ExecuteContext *)rng.m_rnd._8_8_);
  if (((this->m_read & 1U) == 0) || ((this->m_write & 1U) == 0)) {
    if ((this->m_read & 1U) == 0) {
      if ((this->m_write & 1U) != 0) {
        for (uStack_68 = 0; uStack_68 < this->m_size; uStack_68 = uStack_68 + 1) {
          dVar4 = de::Random::getUint8((Random *)&ptr);
          *(deUint8 *)((long)pvVar5 + uStack_68) = dVar4;
        }
      }
    }
    else {
      for (uStack_58 = 0; uStack_58 < this->m_size; uStack_58 = uStack_58 + 1) {
        vVar2 = *(value_type *)((long)pvVar5 + uStack_58);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->m_readData,uStack_58);
        *pvVar7 = vVar2;
      }
    }
  }
  else {
    for (uStack_48 = 0; uStack_48 < this->m_size; uStack_48 = uStack_48 + 1) {
      bVar3 = de::Random::getUint8((Random *)&ptr);
      bVar1 = *(byte *)((long)pvVar5 + uStack_48);
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_readData,uStack_48);
      *pbVar6 = bVar1;
      *(byte *)((long)pvVar5 + uStack_48) = bVar1 ^ bVar3;
    }
  }
  de::Random::~Random((Random *)&ptr);
  return;
}

Assistant:

void HostMemoryAccess::execute (ExecuteContext& context)
{
	de::Random		rng	(m_seed);
	deUint8* const	ptr	= (deUint8*)context.getMapping();

	if (m_read && m_write)
	{
		for (size_t pos = 0; pos < m_size; pos++)
		{
			const deUint8	mask	= rng.getUint8();
			const deUint8	value	= ptr[pos];

			m_readData[pos] = value;
			ptr[pos] = value ^ mask;
		}
	}
	else if (m_read)
	{
		for (size_t pos = 0; pos < m_size; pos++)
		{
			const deUint8	value	= ptr[pos];

			m_readData[pos] = value;
		}
	}
	else if (m_write)
	{
		for (size_t pos = 0; pos < m_size; pos++)
		{
			const deUint8	value	= rng.getUint8();

			ptr[pos] = value;
		}
	}
	else
		DE_FATAL("Host memory access without read or write.");
}